

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_avx2.c
# Opt level: O0

void aom_filter_block1d8_v8_avx2
               (uint8_t *src_ptr,ptrdiff_t src_pitch,uint8_t *output_ptr,ptrdiff_t out_pitch,
               uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  __m128i srcRegFilt8;
  __m128i srcRegFilt6;
  __m128i srcRegFilt4;
  __m128i srcRegFilt1;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m256i forthFilters;
  __m256i thirdFilters;
  __m256i secondFilters;
  __m256i firstFilters;
  __m256i filtersReg32;
  __m256i srcReg32b12;
  __m256i srcReg32b11;
  __m256i srcReg32b10;
  __m256i srcReg32b9;
  __m256i srcReg32b8;
  __m256i srcReg32b7;
  __m256i srcReg32b6;
  __m256i srcReg32b5;
  __m256i srcReg32b4;
  __m256i srcReg32b3;
  __m256i srcReg32b2;
  __m256i srcReg32b1;
  __m256i addFilterReg32;
  __m128i filtersReg;
  __m256i *in_stack_fffffffffffff2e0;
  ptrdiff_t in_stack_fffffffffffff2e8;
  undefined6 in_stack_fffffffffffff2f0;
  undefined2 uVar20;
  void *in_stack_fffffffffffff308;
  void *in_stack_fffffffffffff310;
  undefined8 local_cd0;
  undefined4 local_ca4;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 uStack_b90;
  undefined1 local_b80 [16];
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [24];
  undefined8 uStack_b48;
  undefined1 local_ac0 [32];
  undefined8 local_a38;
  undefined8 local_a28;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_228;
  undefined8 uStack_1f8;
  
  uVar20 = 0x20;
  auVar1 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar1 = vpinsrw_avx(auVar1,0x20,2);
  auVar1 = vpinsrw_avx(auVar1,0x20,3);
  auVar1 = vpinsrw_avx(auVar1,0x20,4);
  auVar1 = vpinsrw_avx(auVar1,0x20,5);
  auVar1 = vpinsrw_avx(auVar1,0x20,6);
  auVar1 = vpinsrw_avx(auVar1,0x20,7);
  auVar18 = vpinsrw_avx(ZEXT216(0x20),0x20,1);
  auVar18 = vpinsrw_avx(auVar18,0x20,2);
  auVar18 = vpinsrw_avx(auVar18,0x20,3);
  auVar18 = vpinsrw_avx(auVar18,0x20,4);
  auVar18 = vpinsrw_avx(auVar18,0x20,5);
  auVar18 = vpinsrw_avx(auVar18,0x20,6);
  auVar18 = vpinsrw_avx(auVar18,0x20,7);
  uStack_4b0 = auVar18._0_8_;
  uStack_4a8 = auVar18._8_8_;
  auVar18 = vpsraw_avx(*in_R9,ZEXT416(1));
  vpacksswb_avx(auVar18,auVar18);
  auVar18 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
  auVar18 = vpinsrw_avx(auVar18,0x100,2);
  auVar18 = vpinsrw_avx(auVar18,0x100,3);
  auVar18 = vpinsrw_avx(auVar18,0x100,4);
  auVar18 = vpinsrw_avx(auVar18,0x100,5);
  auVar18 = vpinsrw_avx(auVar18,0x100,6);
  auVar18 = vpinsrw_avx(auVar18,0x100,7);
  auVar16 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
  auVar16 = vpinsrw_avx(auVar16,0x100,2);
  auVar16 = vpinsrw_avx(auVar16,0x100,3);
  auVar16 = vpinsrw_avx(auVar16,0x100,4);
  auVar16 = vpinsrw_avx(auVar16,0x100,5);
  auVar16 = vpinsrw_avx(auVar16,0x100,6);
  auVar16 = vpinsrw_avx(auVar16,0x100,7);
  uStack_470 = auVar16._0_8_;
  uStack_468 = auVar16._8_8_;
  auVar15._8_8_ = uStack_998;
  auVar15._0_8_ = local_9a0;
  auVar15._16_8_ = local_9a0;
  auVar15._24_8_ = uStack_998;
  auVar3._16_8_ = uStack_470;
  auVar3._0_16_ = auVar18;
  auVar3._24_8_ = uStack_468;
  auVar3 = vpshufb_avx2(auVar15,auVar3);
  auVar18 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar18 = vpinsrw_avx(auVar18,0x302,2);
  auVar18 = vpinsrw_avx(auVar18,0x302,3);
  auVar18 = vpinsrw_avx(auVar18,0x302,4);
  auVar18 = vpinsrw_avx(auVar18,0x302,5);
  auVar18 = vpinsrw_avx(auVar18,0x302,6);
  auVar18 = vpinsrw_avx(auVar18,0x302,7);
  auVar16 = vpinsrw_avx(ZEXT216(0x302),0x302,1);
  auVar16 = vpinsrw_avx(auVar16,0x302,2);
  auVar16 = vpinsrw_avx(auVar16,0x302,3);
  auVar16 = vpinsrw_avx(auVar16,0x302,4);
  auVar16 = vpinsrw_avx(auVar16,0x302,5);
  auVar16 = vpinsrw_avx(auVar16,0x302,6);
  auVar16 = vpinsrw_avx(auVar16,0x302,7);
  uStack_430 = auVar16._0_8_;
  uStack_428 = auVar16._8_8_;
  auVar9._8_8_ = uStack_998;
  auVar9._0_8_ = local_9a0;
  auVar9._16_8_ = local_9a0;
  auVar9._24_8_ = uStack_998;
  auVar4._16_8_ = uStack_430;
  auVar4._0_16_ = auVar18;
  auVar4._24_8_ = uStack_428;
  auVar4 = vpshufb_avx2(auVar9,auVar4);
  auVar18 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar18 = vpinsrw_avx(auVar18,0x504,2);
  auVar18 = vpinsrw_avx(auVar18,0x504,3);
  auVar18 = vpinsrw_avx(auVar18,0x504,4);
  auVar18 = vpinsrw_avx(auVar18,0x504,5);
  auVar18 = vpinsrw_avx(auVar18,0x504,6);
  auVar18 = vpinsrw_avx(auVar18,0x504,7);
  auVar16 = vpinsrw_avx(ZEXT216(0x504),0x504,1);
  auVar16 = vpinsrw_avx(auVar16,0x504,2);
  auVar16 = vpinsrw_avx(auVar16,0x504,3);
  auVar16 = vpinsrw_avx(auVar16,0x504,4);
  auVar16 = vpinsrw_avx(auVar16,0x504,5);
  auVar16 = vpinsrw_avx(auVar16,0x504,6);
  auVar16 = vpinsrw_avx(auVar16,0x504,7);
  uStack_3f0 = auVar16._0_8_;
  uStack_3e8 = auVar16._8_8_;
  auVar8._8_8_ = uStack_998;
  auVar8._0_8_ = local_9a0;
  auVar8._16_8_ = local_9a0;
  auVar8._24_8_ = uStack_998;
  auVar5._16_8_ = uStack_3f0;
  auVar5._0_16_ = auVar18;
  auVar5._24_8_ = uStack_3e8;
  auVar5 = vpshufb_avx2(auVar8,auVar5);
  auVar18 = vpinsrw_avx(ZEXT216(0x706),0x706,1);
  auVar18 = vpinsrw_avx(auVar18,0x706,2);
  auVar18 = vpinsrw_avx(auVar18,0x706,3);
  auVar18 = vpinsrw_avx(auVar18,0x706,4);
  auVar18 = vpinsrw_avx(auVar18,0x706,5);
  auVar18 = vpinsrw_avx(auVar18,0x706,6);
  auVar18 = vpinsrw_avx(auVar18,0x706,7);
  auVar16 = vpinsrw_avx(ZEXT216(0x706),0x706,1);
  auVar16 = vpinsrw_avx(auVar16,0x706,2);
  auVar16 = vpinsrw_avx(auVar16,0x706,3);
  auVar16 = vpinsrw_avx(auVar16,0x706,4);
  auVar16 = vpinsrw_avx(auVar16,0x706,5);
  auVar16 = vpinsrw_avx(auVar16,0x706,6);
  auVar16 = vpinsrw_avx(auVar16,0x706,7);
  uStack_3b0 = auVar16._0_8_;
  uStack_3a8 = auVar16._8_8_;
  auVar7._8_8_ = uStack_998;
  auVar7._0_8_ = local_9a0;
  auVar7._16_8_ = local_9a0;
  auVar7._24_8_ = uStack_998;
  auVar6._16_8_ = uStack_3b0;
  auVar6._0_16_ = auVar18;
  auVar6._24_8_ = uStack_3a8;
  auVar6 = vpshufb_avx2(auVar7,auVar6);
  auVar13 = auVar6;
  xx_loadu2_epi64(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  auVar14 = auVar13;
  xx_loadu2_epi64(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  auVar15 = auVar14;
  xx_loadu2_epi64(in_stack_fffffffffffff310,in_stack_fffffffffffff308);
  local_b60._8_8_ = 0;
  local_b60._0_8_ = *(ulong *)(in_RDI + in_RSI * 6);
  stack0xfffffffffffff4b0 = auVar18;
  auVar7 = vperm2i128_avx2(auVar13,auVar14,0x21);
  auVar8 = vperm2i128_avx2(auVar14,auVar15,0x21);
  auVar9 = vperm2i128_avx2(auVar15,_local_b60,0x21);
  local_bc0 = vpunpcklbw_avx2(auVar13,auVar7);
  local_be0 = vpunpcklbw_avx2(auVar14,auVar8);
  auVar19 = ZEXT3264(auVar9);
  local_ac0 = vpunpcklbw_avx2(auVar15,auVar9);
  local_a38 = in_RDX;
  local_a28 = in_RDI;
  for (local_ca4 = in_R8D; auVar18 = local_b60._0_16_, 1 < local_ca4; local_ca4 = local_ca4 - 2) {
    local_b80._0_8_ = *(ulong *)(local_a28 + in_RSI * 7);
    local_b80._8_8_ = 0;
    uStack_b68 = auVar19._8_8_;
    uVar12 = uStack_b68;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_b80._0_8_;
    auVar16 = ZEXT116(0) * local_b60._16_16_ + ZEXT116(1) * auVar10;
    local_b60._0_8_ = *(ulong *)(local_a28 + in_RSI * 8);
    uStack_b90 = auVar19._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_b60._0_8_;
    auVar17 = ZEXT116(0) * auVar19._0_16_ + ZEXT116(1) * auVar2;
    local_b60._16_8_ = auVar16._0_8_;
    uStack_b48 = auVar16._8_8_;
    uStack_b70 = auVar17._0_8_;
    uStack_b68 = auVar17._8_8_;
    auVar11._16_8_ = local_b60._16_8_;
    auVar11._0_16_ = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar18;
    auVar11._24_8_ = uStack_b48;
    auVar13._16_8_ = uStack_b70;
    auVar13._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * local_b80;
    auVar13._24_8_ = uStack_b68;
    auVar15 = vpunpcklbw_avx2(auVar11,auVar13);
    auVar7 = vpmaddubsw_avx2(local_bc0,auVar3);
    auVar8 = vpmaddubsw_avx2(auVar15,auVar6);
    auVar7 = vpaddsw_avx2(auVar7,auVar8);
    auVar8 = vpmaddubsw_avx2(local_be0,auVar4);
    auVar9 = vpmaddubsw_avx2(local_ac0,auVar5);
    auVar8 = vpaddsw_avx2(auVar8,auVar9);
    auVar7 = vpaddsw_avx2(auVar7,auVar8);
    auVar14._16_8_ = uStack_4b0;
    auVar14._0_16_ = auVar1;
    auVar14._24_8_ = uStack_4a8;
    auVar7 = vpaddsw_avx2(auVar7,auVar14);
    auVar7 = vpsraw_avx2(auVar7,ZEXT416(6));
    uStack_1f8 = SUB328(ZEXT832(0),4);
    vpackuswb_avx2(auVar7,ZEXT832(uStack_1f8) << 0x40);
    local_a28 = in_RSI * 2 + local_a28;
    auVar19 = ZEXT864(uStack_1f8) << 0x40;
    xx_storeu2_epi64((uint8_t *)CONCAT26(uVar20,in_stack_fffffffffffff2f0),in_stack_fffffffffffff2e8
                     ,in_stack_fffffffffffff2e0);
    local_a38 = (undefined8 *)(in_RCX * 2 + (long)local_a38);
    local_bc0 = local_be0;
    local_be0 = local_ac0;
    local_b60._8_8_ = 0;
    local_b60._16_8_ = uStack_b90;
    uStack_b48 = uVar12;
    local_ac0 = auVar15;
  }
  if (local_ca4 != 0) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)(local_a28 + in_RSI * 7);
    auVar16 = vpunpcklbw_avx(auVar18,auVar16);
    auVar18 = vpmaddubsw_avx(local_bc0._0_16_,auVar3._0_16_);
    auVar16 = vpmaddubsw_avx(auVar16,auVar6._0_16_);
    auVar18 = vpaddsw_avx(auVar18,auVar16);
    auVar16 = vpmaddubsw_avx(local_be0._0_16_,auVar4._0_16_);
    auVar2 = vpmaddubsw_avx(local_ac0._0_16_,auVar5._0_16_);
    auVar16 = vpaddsw_avx(auVar16,auVar2);
    auVar18 = vpaddsw_avx(auVar18,auVar16);
    auVar1 = vpaddsw_avx(auVar18,auVar1);
    auVar1 = vpsraw_avx(auVar1,ZEXT416(6));
    uStack_228 = SUB168(ZEXT816(0),4);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uStack_228;
    auVar1 = vpackuswb_avx(auVar1,auVar18 << 0x40);
    local_cd0 = auVar1._0_8_;
    *local_a38 = local_cd0;
  }
  return;
}

Assistant:

static void aom_filter_block1d8_v8_avx2(
    const uint8_t *src_ptr, ptrdiff_t src_pitch, uint8_t *output_ptr,
    ptrdiff_t out_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m256i addFilterReg32;
  __m256i srcReg32b1, srcReg32b2, srcReg32b3, srcReg32b4, srcReg32b5;
  __m256i srcReg32b6, srcReg32b7, srcReg32b8, srcReg32b9, srcReg32b10;
  __m256i srcReg32b11, srcReg32b12, filtersReg32;
  __m256i firstFilters, secondFilters, thirdFilters, forthFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  addFilterReg32 = _mm256_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  // converting the 16 bit (short) to  8 bit (byte) and have the
  // same data in both lanes of 128 bit register.
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);
  // have the same data in both lanes of a 256 bit register
  filtersReg32 = MM256_BROADCASTSI128_SI256(filtersReg);

  // duplicate only the first 16 bits (first and second byte)
  // across 256 bit register
  firstFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x100u));
  // duplicate only the second 16 bits (third and forth byte)
  // across 256 bit register
  secondFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 256 bit register
  thirdFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x504u));
  // duplicate only the forth 16 bits (seventh and eighth byte)
  // across 256 bit register
  forthFilters = _mm256_shuffle_epi8(filtersReg32, _mm256_set1_epi16(0x706u));

  // multiple the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = out_pitch << 1;

  // load 16 bytes 7 times in stride of src_pitch
  srcReg32b1 = xx_loadu2_epi64(src_ptr + src_pitch, src_ptr);
  srcReg32b3 =
      xx_loadu2_epi64(src_ptr + src_pitch * 3, src_ptr + src_pitch * 2);
  srcReg32b5 =
      xx_loadu2_epi64(src_ptr + src_pitch * 5, src_ptr + src_pitch * 4);
  srcReg32b7 = _mm256_castsi128_si256(
      _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 6)));

  // have each consecutive loads on the same 256 register
  srcReg32b2 = _mm256_permute2x128_si256(srcReg32b1, srcReg32b3, 0x21);
  srcReg32b4 = _mm256_permute2x128_si256(srcReg32b3, srcReg32b5, 0x21);
  srcReg32b6 = _mm256_permute2x128_si256(srcReg32b5, srcReg32b7, 0x21);
  // merge every two consecutive registers except the last one
  srcReg32b10 = _mm256_unpacklo_epi8(srcReg32b1, srcReg32b2);
  srcReg32b11 = _mm256_unpacklo_epi8(srcReg32b3, srcReg32b4);
  srcReg32b2 = _mm256_unpacklo_epi8(srcReg32b5, srcReg32b6);

  for (i = output_height; i > 1; i -= 2) {
    // load the last 2 loads of 16 bytes and have every two
    // consecutive loads in the same 256 bit register
    srcReg32b8 = _mm256_castsi128_si256(
        _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 7)));
    srcReg32b7 = _mm256_inserti128_si256(srcReg32b7,
                                         _mm256_castsi256_si128(srcReg32b8), 1);
    srcReg32b9 = _mm256_castsi128_si256(
        _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 8)));
    srcReg32b8 = _mm256_inserti128_si256(srcReg32b8,
                                         _mm256_castsi256_si128(srcReg32b9), 1);

    // merge every two consecutive registers
    // save
    srcReg32b4 = _mm256_unpacklo_epi8(srcReg32b7, srcReg32b8);

    // multiply 2 adjacent elements with the filter and add the result
    srcReg32b10 = _mm256_maddubs_epi16(srcReg32b10, firstFilters);
    srcReg32b6 = _mm256_maddubs_epi16(srcReg32b4, forthFilters);

    // add and saturate the results together
    srcReg32b10 = _mm256_adds_epi16(srcReg32b10, srcReg32b6);

    // multiply 2 adjacent elements with the filter and add the result
    srcReg32b8 = _mm256_maddubs_epi16(srcReg32b11, secondFilters);
    srcReg32b12 = _mm256_maddubs_epi16(srcReg32b2, thirdFilters);

    // add and saturate the results together
    srcReg32b10 = _mm256_adds_epi16(srcReg32b10,
                                    _mm256_adds_epi16(srcReg32b8, srcReg32b12));

    // shift by 6 bit each 16 bit
    srcReg32b10 = _mm256_adds_epi16(srcReg32b10, addFilterReg32);
    srcReg32b10 = _mm256_srai_epi16(srcReg32b10, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    srcReg32b1 = _mm256_packus_epi16(srcReg32b10, _mm256_setzero_si256());

    src_ptr += src_stride;

    xx_storeu2_epi64(output_ptr, out_pitch, &srcReg32b1);

    output_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg32b10 = srcReg32b11;
    srcReg32b11 = srcReg32b2;
    srcReg32b2 = srcReg32b4;
    srcReg32b7 = srcReg32b9;
  }
  if (i > 0) {
    __m128i srcRegFilt1, srcRegFilt4, srcRegFilt6, srcRegFilt8;
    // load the last 16 bytes
    srcRegFilt8 = _mm_loadl_epi64((const __m128i *)(src_ptr + src_pitch * 7));

    // merge the last 2 results together
    srcRegFilt4 =
        _mm_unpacklo_epi8(_mm256_castsi256_si128(srcReg32b7), srcRegFilt8);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt1 = _mm_maddubs_epi16(_mm256_castsi256_si128(srcReg32b10),
                                    _mm256_castsi256_si128(firstFilters));
    srcRegFilt4 =
        _mm_maddubs_epi16(srcRegFilt4, _mm256_castsi256_si128(forthFilters));

    // add and saturate the results together
    srcRegFilt1 = _mm_adds_epi16(srcRegFilt1, srcRegFilt4);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt4 = _mm_maddubs_epi16(_mm256_castsi256_si128(srcReg32b11),
                                    _mm256_castsi256_si128(secondFilters));

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt6 = _mm_maddubs_epi16(_mm256_castsi256_si128(srcReg32b2),
                                    _mm256_castsi256_si128(thirdFilters));

    // add and saturate the results together
    srcRegFilt1 =
        _mm_adds_epi16(srcRegFilt1, _mm_adds_epi16(srcRegFilt4, srcRegFilt6));

    // shift by 6 bit each 16 bit
    srcRegFilt1 =
        _mm_adds_epi16(srcRegFilt1, _mm256_castsi256_si128(addFilterReg32));
    srcRegFilt1 = _mm_srai_epi16(srcRegFilt1, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve result
    srcRegFilt1 = _mm_packus_epi16(srcRegFilt1, _mm_setzero_si128());

    // save 8 bytes
    _mm_storel_epi64((__m128i *)output_ptr, srcRegFilt1);
  }
}